

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_fields_test.cc
# Opt level: O2

size_t google::protobuf::internal::anon_unknown_0::
       MapKeyByteSizeLong<google::protobuf::internal::MapDynamicFieldInt32KeyInfo>
                 (Type type,MapDynamicFieldInt32KeyInfo info)

{
  int32_t value;
  size_t sVar1;
  
  value = MapKey::GetInt32Value(info.key);
  sVar1 = MapPrimitiveFieldByteSize<(google::protobuf::internal::FieldDescriptorLite::CppType)1,int>
                    (type,value);
  return sVar1;
}

Assistant:

inline size_t MapKeyByteSizeLong(FieldDescriptor::Type type, InfoT info) {
  // There is a bug in GCC 9.5 where if-constexpr arguments are not understood
  // if passed into a helper function. A reproduction of the bug can be found
  // at: https://godbolt.org/z/65qW3vGhP
  // This is fixed in GCC 10.1+.
  (void)type;  // Suppress -Wunused-but-set-parameter

  if constexpr (info.cpp_type == FieldDescriptor::CPPTYPE_STRING) {
    return WireFormatLite::StringSize(info.Get());
  } else {
    return MapPrimitiveFieldByteSize<info.cpp_type>(type, info.Get());
  }
}